

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcomp.c
# Opt level: O0

uint objemt(mcmcxdef *ctx,objnum objn,prpnum prop,dattyp typ)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  char in_CL;
  ushort in_DX;
  ushort in_SI;
  long *in_RDI;
  ushort newsiz;
  errdef fr_;
  prpdef *p;
  objdef *objptr;
  errdef *in_stack_fffffffffffffe88;
  uchar *p_00;
  errcxdef *in_stack_fffffffffffffe90;
  mcmcxdef *in_stack_fffffffffffffe98;
  errcxdef *peVar4;
  undefined6 in_stack_fffffffffffffea0;
  undefined8 local_158;
  int local_150;
  int in_stack_fffffffffffffed8;
  prpnum in_stack_fffffffffffffedc;
  objnum in_stack_fffffffffffffede;
  mcmcxdef *in_stack_fffffffffffffee0;
  __jmp_buf_tag _Stack_e8;
  char *local_20;
  errcxdef *local_18;
  char local_10;
  ushort local_c;
  ushort local_a;
  long *local_8;
  
  local_c = in_DX;
  local_a = in_SI;
  local_8 = in_RDI;
  local_10 = in_CL;
  local_18 = (errcxdef *)
             mcmlck(in_stack_fffffffffffffe98,(mcmon)((ulong)in_stack_fffffffffffffe90 >> 0x30));
  local_150 = _setjmp(&_Stack_e8);
  if (local_150 == 0) {
    local_158 = **(undefined8 **)(*local_8 + 8);
    **(long **)(*local_8 + 8) = (long)&local_158;
    objdelp(in_stack_fffffffffffffee0,in_stack_fffffffffffffede,in_stack_fffffffffffffedc,
            in_stack_fffffffffffffed8);
    peVar4 = local_18;
    uVar1 = osrp2(&local_18->errcxlog);
    local_20 = peVar4->errcxbuf + (long)(int)(uVar1 & 0xffff) + -0x1c;
    if ((long)(ulong)*(ushort *)
                      (*(long *)(*(long *)*local_8 +
                                (long)((int)(uint)*(ushort *)
                                                   (local_8[(long)((int)(uint)local_a >> 8) + 6] +
                                                   (long)(int)(local_a & 0xff) * 2) >> 8) * 8) +
                       (long)(int)(*(ushort *)
                                    (local_8[(long)((int)(uint)local_a >> 8) + 6] +
                                    (long)(int)(local_a & 0xff) * 2) & 0xff) * 0x20 + 0x18) <=
        (long)(local_20 + (6 - (long)local_18))) {
      iVar2 = osrp2(&local_18->errcxlog);
      in_stack_fffffffffffffe90 =
           (errcxdef *)
           objexp((mcmcxdef *)
                  CONCAT26(((short)iVar2 -
                           *(short *)(*(long *)(*(long *)*local_8 +
                                               (long)((int)(uint)*(ushort *)
                                                                  (local_8[(long)((int)(uint)local_a
                                                                                 >> 8) + 6] +
                                                                  (long)(int)(local_a & 0xff) * 2)
                                                     >> 8) * 8) +
                                      (long)(int)(*(ushort *)
                                                   (local_8[(long)((int)(uint)local_a >> 8) + 6] +
                                                   (long)(int)(local_a & 0xff) * 2) & 0xff) * 0x20 +
                                     0x18)) + 0x46,in_stack_fffffffffffffea0),
                  (objnum)((ulong)peVar4 >> 0x30),(ushort *)in_stack_fffffffffffffe90);
      local_18 = in_stack_fffffffffffffe90;
      uVar1 = osrp2(&in_stack_fffffffffffffe90->errcxlog);
      local_20 = in_stack_fffffffffffffe90->errcxbuf + (long)(int)(uVar1 & 0xffff) + -0x1c;
    }
    oswp2(local_20,(uint)local_c);
    local_20[2] = local_10;
    local_20[5] = '\0';
    p_00 = (uchar *)((long)&local_18->errcxptr + 6);
    uVar1 = osrp2((uchar *)((long)&local_18->errcxptr + 6));
    oswp2(p_00,(uVar1 & 0xffff) + 1);
    **(undefined8 **)(*local_8 + 8) = local_158;
    lVar3 = *(long *)(*(long *)*local_8 +
                     (long)((int)(uint)*(ushort *)
                                        (local_8[(long)((int)(uint)local_a >> 8) + 6] +
                                        (long)(int)(local_a & 0xff) * 2) >> 8) * 8) +
            (long)(int)(*(ushort *)
                         (local_8[(long)((int)(uint)local_a >> 8) + 6] +
                         (long)(int)(local_a & 0xff) * 2) & 0xff) * 0x20;
    *(ushort *)(lVar3 + 0x14) = *(ushort *)(lVar3 + 0x14) | 1;
    mcmunlck((mcmcxdef *)in_stack_fffffffffffffe90,(mcmon)((ulong)p_00 >> 0x30));
    return ((int)local_20 + 6) - (int)local_18;
  }
  **(undefined8 **)(*local_8 + 8) = local_158;
  mcmunlck((mcmcxdef *)in_stack_fffffffffffffe90,(mcmon)((ulong)in_stack_fffffffffffffe88 >> 0x30));
  errrse1(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
}

Assistant:

uint objemt(mcmcxdef *ctx, objnum objn, prpnum prop, dattyp typ)
{
    objdef *objptr;
    prpdef *p;
    
    objptr = (objdef *)mcmlck(ctx, (mcmon)objn);
    
    ERRBEGIN(ctx->mcmcxgl->mcmcxerr)

    objdelp(ctx, objn, prop, FALSE);   /* delete old property value, if any */
    p = objpfre(objptr);                        /* get top of property area */
    
    if ((char *)p - (char *)objptr + PRPHDRSIZ >=
        mcmobjsiz(ctx, (mcmon)objn))
    {
        ushort newsiz = 64 + ((objfree(objptr) + PRPHDRSIZ) -
                              mcmobjsiz(ctx, (mcmon)objn));
        objptr = objexp(ctx, objn, &newsiz);
        p = objpfre(objptr);                       /* object may have moved */
    }
    
    /* set up property header as much as we can (don't know size yet) */
    prpsetprop(p, prop);
    prptype(p) = typ;
    prpflg(p) = 0;
    objsnp(objptr, objnprop(objptr) + 1);              /* one more property */

    ERRCLEAN(ctx->mcmcxgl->mcmcxerr)
        mcmunlck(ctx, (mcmon)objn);
    ERRENDCLN(ctx->mcmcxgl->mcmcxerr)

    /* dirty the cache object and release the lock before return */
    mcmtch(ctx, objn);
    mcmunlck(ctx, (mcmon)objn);
    return(((uchar *)prpvalp(p)) - ((uchar *)objptr));
}